

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O0

void __thiscall
FIX::SocketConnection::readMessages(SocketConnection *this,SocketMonitor *socketMonitor)

{
  Session *this_00;
  bool bVar1;
  InvalidMessage *anon_var_0;
  undefined1 local_38 [8];
  string message;
  SocketMonitor *socketMonitor_local;
  SocketConnection *this_local;
  
  if (this->m_pSession != (Session *)0x0) {
    message.field_2._8_8_ = socketMonitor;
    std::__cxx11::string::string((string *)local_38);
    while (bVar1 = readMessage(this,(string *)local_38), bVar1) {
      this_00 = this->m_pSession;
      UtcTimeStamp::now();
      Session::next(this_00,(string *)local_38,(UtcTimeStamp *)&anon_var_0,false);
      UtcTimeStamp::~UtcTimeStamp((UtcTimeStamp *)&anon_var_0);
    }
    std::__cxx11::string::~string((string *)local_38);
  }
  return;
}

Assistant:

void SocketConnection::readMessages(SocketMonitor &socketMonitor) {
  if (!m_pSession) {
    return;
  }

  std::string message;
  while (readMessage(message)) {
    try {
      m_pSession->next(message, UtcTimeStamp::now());
    } catch (InvalidMessage &) {
      if (!m_pSession->isLoggedOn()) {
        socketMonitor.drop(m_socket);
      }
    }
  }
}